

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::Clear(X3DImporter *this)

{
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar1;
  _List_node_base *p_Var2;
  iterator it;
  _List_node_base *p_Var3;
  
  this->NodeElement_Cur = (CX3DImporter_NodeElement *)0x0;
  plVar1 = &this->NodeElement_List;
  p_Var3 = (this->NodeElement_List).
           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)plVar1) {
    do {
      if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
        (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 8))();
      }
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)plVar1);
    p_Var3 = (plVar1->
             super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)plVar1) {
      p_Var2 = p_Var3->_M_next;
      operator_delete(p_Var3);
      p_Var3 = p_Var2;
    }
    (this->NodeElement_List).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
    (this->NodeElement_List).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
    (this->NodeElement_List).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
  }
  return;
}

Assistant:

void X3DImporter::Clear() {
	NodeElement_Cur = nullptr;
	// Delete all elements
	if(!NodeElement_List.empty()) {
        for ( std::list<CX3DImporter_NodeElement*>::iterator it = NodeElement_List.begin(); it != NodeElement_List.end(); ++it ) {
            delete *it;
        }
		NodeElement_List.clear();
	}
}